

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O3

void av1_highbd_dr_prediction_z1_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_above,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  uint16_t uVar3;
  ushort uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  int iVar11;
  long lVar12;
  undefined1 (*pauVar13) [32];
  ulong uVar14;
  uint uVar15;
  undefined1 (*pauVar16) [16];
  ulong uVar17;
  int iVar18;
  uint uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  ushort uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar37 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar46 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar69 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  int in_stack_fffffffffffff780;
  undefined8 local_860 [262];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  uVar17 = (ulong)(uint)bh;
  if (bw < 0x10) {
    bVar10 = (byte)upsample_above;
    if (bw == 4) {
      iVar11 = bh + 3 << (bVar10 & 0x1f);
      uVar3 = above[iVar11];
      auVar22._2_2_ = uVar3;
      auVar22._0_2_ = uVar3;
      auVar22._4_2_ = uVar3;
      auVar22._6_2_ = uVar3;
      auVar22._8_2_ = uVar3;
      auVar22._10_2_ = uVar3;
      auVar22._12_2_ = uVar3;
      auVar22._14_2_ = uVar3;
      if (bd < 0xc) {
        if (bh < 1) {
          return;
        }
        auVar49._0_2_ = (undefined2)iVar11;
        auVar49._2_2_ = auVar49._0_2_;
        auVar49._4_2_ = auVar49._0_2_;
        auVar49._6_2_ = auVar49._0_2_;
        auVar49._8_2_ = auVar49._0_2_;
        auVar49._10_2_ = auVar49._0_2_;
        auVar49._12_2_ = auVar49._0_2_;
        auVar49._14_2_ = auVar49._0_2_;
        pauVar16 = (undefined1 (*) [16])local_860;
        uVar14 = 0;
        auVar80._8_2_ = 0x10;
        auVar80._0_8_ = 0x10001000100010;
        auVar80._10_2_ = 0x10;
        auVar80._12_2_ = 0x10;
        auVar80._14_2_ = 0x10;
        auVar58._8_2_ = 0x1f;
        auVar58._0_8_ = 0x1f001f001f001f;
        auVar58._10_2_ = 0x1f;
        auVar58._12_2_ = 0x1f;
        auVar58._14_2_ = 0x1f;
        auVar58._16_2_ = 0x1f;
        auVar58._18_2_ = 0x1f;
        auVar58._20_2_ = 0x1f;
        auVar58._22_2_ = 0x1f;
        auVar58._24_2_ = 0x1f;
        auVar58._26_2_ = 0x1f;
        auVar58._28_2_ = 0x1f;
        auVar58._30_2_ = 0x1f;
        uVar15 = dx;
        do {
          uVar19 = (int)uVar15 >> (6 - bVar10 & 0x1f);
          if (iVar11 <= (int)uVar19) {
            if ((int)uVar14 < bh) {
              lVar12 = uVar17 - uVar14;
              do {
                *pauVar16 = auVar22;
                pauVar16 = pauVar16 + 1;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            break;
          }
          auVar39 = *(undefined1 (*) [16])(above + (int)uVar19);
          auVar46._0_2_ = (undefined2)uVar19;
          if (upsample_above == 0) {
            auVar45 = *(undefined1 (*) [16])(above + (long)(int)uVar19 + 1);
            auVar75._2_2_ = auVar46._0_2_;
            auVar75._0_2_ = auVar46._0_2_;
            auVar75._4_2_ = auVar46._0_2_;
            auVar75._6_2_ = auVar46._0_2_;
            auVar75._8_2_ = auVar46._0_2_;
            auVar75._10_2_ = auVar46._0_2_;
            auVar75._12_2_ = auVar46._0_2_;
            auVar75._14_2_ = auVar46._0_2_;
            auVar68 = vpaddw_avx(auVar75,ZEXT816(0x7000600050004));
            auVar46 = vpinsrw_avx(ZEXT416(uVar19),uVar19 + 1,1);
            auVar46 = vpinsrw_avx(auVar46,uVar19 + 2,2);
            auVar46 = vpinsrw_avx(auVar46,uVar19 + 3,3);
            auVar68 = vpunpcklqdq_avx(auVar46,auVar68);
            uVar4 = (ushort)(uVar15 >> 1);
            uVar33 = uVar4 & 0x1f;
            auVar81._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f
            ;
            auVar81._8_2_ = uVar33;
            auVar81._10_2_ = uVar33;
            auVar81._12_2_ = uVar33;
            auVar81._14_2_ = uVar33;
          }
          else {
            auVar39 = vpshufb_avx(auVar39,_DAT_0050f240);
            auVar45 = vpsrldq_avx(auVar39,8);
            auVar46._2_2_ = auVar46._0_2_;
            auVar46._4_2_ = auVar46._0_2_;
            auVar46._6_2_ = auVar46._0_2_;
            auVar46._8_2_ = auVar46._0_2_;
            auVar46._10_2_ = auVar46._0_2_;
            auVar46._12_2_ = auVar46._0_2_;
            auVar46._14_2_ = auVar46._0_2_;
            auVar68 = vpinsrw_avx(ZEXT416(uVar19),uVar19 + 2,1);
            auVar68 = vpinsrw_avx(auVar68,uVar19 + 4,2);
            auVar81 = vpinsrw_avx(auVar68,uVar19 + 6,3);
            auVar68 = vpaddw_avx(auVar46,ZEXT816(0xe000c000a0008));
            auVar68 = vpunpcklqdq_avx(auVar81,auVar68);
            auVar82._0_2_ = (undefined2)uVar15;
            auVar82._2_2_ = auVar82._0_2_;
            auVar82._4_2_ = auVar82._0_2_;
            auVar82._6_2_ = auVar82._0_2_;
            auVar82._8_2_ = auVar82._0_2_;
            auVar82._10_2_ = auVar82._0_2_;
            auVar82._12_2_ = auVar82._0_2_;
            auVar82._14_2_ = auVar82._0_2_;
            auVar82._16_2_ = auVar82._0_2_;
            auVar82._18_2_ = auVar82._0_2_;
            auVar82._20_2_ = auVar82._0_2_;
            auVar82._22_2_ = auVar82._0_2_;
            auVar82._24_2_ = auVar82._0_2_;
            auVar82._26_2_ = auVar82._0_2_;
            auVar82._28_2_ = auVar82._0_2_;
            auVar82._30_2_ = auVar82._0_2_;
            auVar42 = vpsllw_avx2(auVar82,ZEXT416((uint)upsample_above));
            auVar42 = vpsrlw_avx2(auVar42,1);
            auVar42 = vpand_avx2(auVar42,auVar58);
            auVar81 = auVar42._0_16_;
          }
          auVar68 = vpcmpgtw_avx(auVar49,auVar68);
          auVar45 = vpsubw_avx(auVar45,auVar39);
          auVar45 = vpmullw_avx(auVar45,auVar81);
          auVar39 = vpsllw_avx(auVar39,5);
          auVar39 = vpaddw_avx(auVar39,auVar80);
          auVar39 = vpaddw_avx(auVar45,auVar39);
          auVar39 = vpsrlw_avx(auVar39,5);
          auVar39 = vpblendvb_avx(auVar22,auVar39,auVar68);
          *pauVar16 = auVar39;
          uVar15 = uVar15 + dx;
          uVar14 = uVar14 + 1;
          pauVar16 = pauVar16 + 1;
        } while (uVar17 != uVar14);
      }
      else {
        if (bh < 1) {
          return;
        }
        auVar39._4_4_ = iVar11;
        auVar39._0_4_ = iVar11;
        auVar39._8_4_ = iVar11;
        auVar39._12_4_ = iVar11;
        pauVar16 = (undefined1 (*) [16])local_860;
        uVar14 = 0;
        auVar45._8_4_ = 0x10;
        auVar45._0_8_ = 0x1000000010;
        auVar45._12_4_ = 0x10;
        auVar42._8_4_ = 0x1f;
        auVar42._0_8_ = 0x1f0000001f;
        auVar42._12_4_ = 0x1f;
        auVar42._16_4_ = 0x1f;
        auVar42._20_4_ = 0x1f;
        auVar42._24_4_ = 0x1f;
        auVar42._28_4_ = 0x1f;
        uVar15 = dx;
        do {
          uVar19 = (int)uVar15 >> (6 - bVar10 & 0x1f);
          if (iVar11 <= (int)uVar19) {
            if ((int)uVar14 < bh) {
              lVar12 = uVar17 - uVar14;
              do {
                *pauVar16 = auVar22;
                pauVar16 = pauVar16 + 1;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            break;
          }
          auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (int)uVar19));
          auVar49 = auVar35._0_16_;
          if (upsample_above == 0) {
            auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar19 + 1));
            auVar46 = auVar35._0_16_;
            auVar80 = vpinsrd_avx(ZEXT416(uVar19),uVar19 + 1,1);
            auVar80 = vpinsrd_avx(auVar80,uVar19 + 2,2);
            auVar80 = vpinsrd_avx(auVar80,uVar19 + 3,3);
            uVar19 = uVar15 >> 1;
            auVar68._0_8_ = CONCAT44(uVar19,uVar19) & 0x1f0000001f;
            auVar68._8_4_ = uVar19 & 0x1f;
            auVar68._12_4_ = uVar19 & 0x1f;
          }
          else {
            auVar35 = vpshufd_avx2(auVar35,0xd8);
            auVar35 = vpermq_avx2(auVar35,0xd8);
            auVar49 = auVar35._0_16_;
            auVar46 = ZEXT116(0) * auVar22 + ZEXT116(1) * auVar35._16_16_;
            auVar80 = vpinsrd_avx(ZEXT416(uVar19),uVar19 + 2,1);
            auVar80 = vpinsrd_avx(auVar80,uVar19 + 4,2);
            auVar80 = vpinsrd_avx(auVar80,uVar19 + 6,3);
            auVar35._4_4_ = uVar15;
            auVar35._0_4_ = uVar15;
            auVar35._8_4_ = uVar15;
            auVar35._12_4_ = uVar15;
            auVar35._16_4_ = uVar15;
            auVar35._20_4_ = uVar15;
            auVar35._24_4_ = uVar15;
            auVar35._28_4_ = uVar15;
            auVar35 = vpslld_avx2(auVar35,ZEXT416((uint)upsample_above));
            auVar35 = vpsrld_avx2(auVar35,1);
            auVar35 = vpand_avx2(auVar35,auVar42);
            auVar68 = auVar35._0_16_;
          }
          auVar81 = vpcmpgtd_avx(auVar39,auVar80);
          auVar80 = vpsubd_avx(auVar46,auVar49);
          auVar80 = vpmulld_avx(auVar80,auVar68);
          auVar49 = vpslld_avx(auVar49,5);
          auVar49 = vpaddd_avx(auVar49,auVar45);
          auVar49 = vpaddd_avx(auVar80,auVar49);
          auVar49 = vpsrld_avx(auVar49,5);
          auVar80 = vpackusdw_avx(auVar49,auVar49);
          auVar49 = vpackssdw_avx(auVar81,auVar81);
          auVar49 = vpblendvb_avx(auVar22,auVar80,auVar49);
          *pauVar16 = auVar49;
          uVar15 = uVar15 + dx;
          uVar14 = uVar14 + 1;
          pauVar16 = pauVar16 + 1;
        } while (uVar17 != uVar14);
      }
      if (0 < bh) {
        lVar12 = 0;
        do {
          *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar12);
          lVar12 = lVar12 + 0x10;
          dst = dst + stride;
        } while ((ulong)(uint)bh << 4 != lVar12);
      }
    }
    else if (bw == 8) {
      iVar11 = bh + 7 << (bVar10 & 0x1f);
      if (bd < 0xc) {
        if (bh < 1) {
          return;
        }
        uVar3 = above[iVar11];
        auVar20._2_2_ = uVar3;
        auVar20._0_2_ = uVar3;
        auVar20._4_2_ = uVar3;
        auVar20._6_2_ = uVar3;
        auVar20._8_2_ = uVar3;
        auVar20._10_2_ = uVar3;
        auVar20._12_2_ = uVar3;
        auVar20._14_2_ = uVar3;
        auVar26._0_2_ = (undefined2)iVar11;
        auVar26._2_2_ = auVar26._0_2_;
        auVar26._4_2_ = auVar26._0_2_;
        auVar26._6_2_ = auVar26._0_2_;
        auVar26._8_2_ = auVar26._0_2_;
        auVar26._10_2_ = auVar26._0_2_;
        auVar26._12_2_ = auVar26._0_2_;
        auVar26._14_2_ = auVar26._0_2_;
        pauVar16 = (undefined1 (*) [16])local_860;
        uVar14 = 0;
        auVar29._8_2_ = 0x10;
        auVar29._0_8_ = 0x10001000100010;
        auVar29._10_2_ = 0x10;
        auVar29._12_2_ = 0x10;
        auVar29._14_2_ = 0x10;
        auVar41._8_2_ = 0x1f;
        auVar41._0_8_ = 0x1f001f001f001f;
        auVar41._10_2_ = 0x1f;
        auVar41._12_2_ = 0x1f;
        auVar41._14_2_ = 0x1f;
        auVar41._16_2_ = 0x1f;
        auVar41._18_2_ = 0x1f;
        auVar41._20_2_ = 0x1f;
        auVar41._22_2_ = 0x1f;
        auVar41._24_2_ = 0x1f;
        auVar41._26_2_ = 0x1f;
        auVar41._28_2_ = 0x1f;
        auVar41._30_2_ = 0x1f;
        uVar15 = dx;
        do {
          uVar19 = (int)uVar15 >> (6 - bVar10 & 0x1f);
          if (iVar11 <= (int)uVar19) {
            if ((int)uVar14 < bh) {
              lVar12 = uVar17 - uVar14;
              do {
                *pauVar16 = auVar20;
                pauVar16 = pauVar16 + 1;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            break;
          }
          auVar22 = *(undefined1 (*) [16])(above + (int)uVar19);
          if (upsample_above == 0) {
            auVar39 = *(undefined1 (*) [16])(above + (long)(int)uVar19 + 1);
            auVar45 = vpinsrw_avx(ZEXT416(uVar19),uVar19 + 1,1);
            auVar45 = vpinsrw_avx(auVar45,uVar19 + 2,2);
            auVar45 = vpinsrw_avx(auVar45,uVar19 + 3,3);
            auVar45 = vpinsrw_avx(auVar45,uVar19 + 4,4);
            auVar45 = vpinsrw_avx(auVar45,uVar19 + 5,5);
            auVar45 = vpinsrw_avx(auVar45,uVar19 + 6,6);
            auVar45 = vpinsrw_avx(auVar45,uVar19 + 7,7);
            uVar4 = (ushort)(uVar15 >> 1);
            uVar33 = uVar4 & 0x1f;
            auVar69._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f
            ;
            auVar69._8_2_ = uVar33;
            auVar69._10_2_ = uVar33;
            auVar69._12_2_ = uVar33;
            auVar69._14_2_ = uVar33;
          }
          else {
            auVar39 = vpblendw_avx(auVar22,(undefined1  [16])0x0,0xaa);
            auVar45 = vpblendw_avx(*(undefined1 (*) [16])(above + (long)(int)uVar19 + 8),
                                   (undefined1  [16])0x0,0xaa);
            auVar80 = vpsrld_avx(auVar22,0x10);
            auVar22 = vpackusdw_avx(auVar39,auVar45);
            auVar49 = vpsrld_avx(*(undefined1 (*) [16])(above + (long)(int)uVar19 + 8),0x10);
            auVar39 = vpinsrw_avx(ZEXT416(uVar19),uVar19 + 2,1);
            auVar39 = vpinsrw_avx(auVar39,uVar19 + 4,2);
            auVar39 = vpinsrw_avx(auVar39,uVar19 + 6,3);
            auVar39 = vpinsrw_avx(auVar39,uVar19 + 8,4);
            auVar39 = vpinsrw_avx(auVar39,uVar19 + 10,5);
            auVar39 = vpinsrw_avx(auVar39,uVar19 + 0xc,6);
            auVar45 = vpinsrw_avx(auVar39,uVar19 + 0xe,7);
            auVar71._0_2_ = (undefined2)uVar15;
            auVar71._2_2_ = auVar71._0_2_;
            auVar71._4_2_ = auVar71._0_2_;
            auVar71._6_2_ = auVar71._0_2_;
            auVar71._8_2_ = auVar71._0_2_;
            auVar71._10_2_ = auVar71._0_2_;
            auVar71._12_2_ = auVar71._0_2_;
            auVar71._14_2_ = auVar71._0_2_;
            auVar71._16_2_ = auVar71._0_2_;
            auVar71._18_2_ = auVar71._0_2_;
            auVar71._20_2_ = auVar71._0_2_;
            auVar71._22_2_ = auVar71._0_2_;
            auVar71._24_2_ = auVar71._0_2_;
            auVar71._26_2_ = auVar71._0_2_;
            auVar71._28_2_ = auVar71._0_2_;
            auVar71._30_2_ = auVar71._0_2_;
            auVar42 = vpsllw_avx2(auVar71,ZEXT416((uint)upsample_above));
            auVar39 = vpackusdw_avx(auVar80,auVar49);
            auVar42 = vpsrlw_avx2(auVar42,1);
            auVar42 = vpand_avx2(auVar42,auVar41);
            auVar69 = auVar42._0_16_;
          }
          auVar49 = vpsllw_avx(auVar22,5);
          auVar49 = vpaddw_avx(auVar49,auVar29);
          auVar22 = vpsubw_avx(auVar39,auVar22);
          auVar22 = vpmullw_avx(auVar69,auVar22);
          auVar22 = vpaddw_avx(auVar49,auVar22);
          auVar39 = vpsrlw_avx(auVar22,5);
          auVar22 = vpcmpgtw_avx(auVar26,auVar45);
          auVar22 = vpblendvb_avx(auVar20,auVar39,auVar22);
          *pauVar16 = auVar22;
          uVar15 = uVar15 + dx;
          uVar14 = uVar14 + 1;
          pauVar16 = pauVar16 + 1;
        } while (uVar17 != uVar14);
      }
      else {
        if (bh < 1) {
          return;
        }
        auVar28._4_4_ = iVar11;
        auVar28._0_4_ = iVar11;
        auVar28._8_4_ = iVar11;
        auVar28._12_4_ = iVar11;
        auVar28._16_4_ = iVar11;
        auVar28._20_4_ = iVar11;
        auVar28._24_4_ = iVar11;
        auVar28._28_4_ = iVar11;
        uVar3 = above[iVar11];
        auVar23._2_2_ = uVar3;
        auVar23._0_2_ = uVar3;
        auVar23._4_2_ = uVar3;
        auVar23._6_2_ = uVar3;
        auVar23._8_2_ = uVar3;
        auVar23._10_2_ = uVar3;
        auVar23._12_2_ = uVar3;
        auVar23._14_2_ = uVar3;
        auVar25._16_2_ = uVar3;
        auVar25._0_16_ = auVar23;
        auVar25._18_2_ = uVar3;
        auVar25._20_2_ = uVar3;
        auVar25._22_2_ = uVar3;
        auVar25._24_2_ = uVar3;
        auVar25._26_2_ = uVar3;
        auVar25._28_2_ = uVar3;
        auVar25._30_2_ = uVar3;
        pauVar16 = (undefined1 (*) [16])local_860;
        uVar14 = 0;
        auVar22 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar32._8_4_ = 0x10;
        auVar32._0_8_ = 0x1000000010;
        auVar32._12_4_ = 0x10;
        auVar32._16_4_ = 0x10;
        auVar32._20_4_ = 0x10;
        auVar32._24_4_ = 0x10;
        auVar32._28_4_ = 0x10;
        auVar39 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar48._8_4_ = 0x1f;
        auVar48._0_8_ = 0x1f0000001f;
        auVar48._12_4_ = 0x1f;
        auVar48._16_4_ = 0x1f;
        auVar48._20_4_ = 0x1f;
        auVar48._24_4_ = 0x1f;
        auVar48._28_4_ = 0x1f;
        uVar15 = dx;
        do {
          iVar18 = (int)uVar15 >> (6 - bVar10 & 0x1f);
          if (iVar11 <= iVar18) {
            if ((int)uVar14 < bh) {
              lVar12 = uVar17 - uVar14;
              do {
                *pauVar16 = auVar23;
                pauVar16 = pauVar16 + 1;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            break;
          }
          auVar67 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + iVar18));
          if (upsample_above == 0) {
            auVar42 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)iVar18 + 1));
            auVar70._4_4_ = iVar18;
            auVar70._0_4_ = iVar18;
            auVar70._8_4_ = iVar18;
            auVar70._12_4_ = iVar18;
            iVar1 = iVar18 + 5;
            iVar2 = iVar18 + 6;
            iVar18 = iVar18 + 7;
            auVar45 = vpaddd_avx(auVar70,auVar22);
            auVar35 = vpermq_avx2(ZEXT1632(auVar45),0xc4);
            auVar35 = vpblendd_avx2(auVar35,ZEXT1632(auVar70),1);
            auVar76._4_4_ = iVar1;
            auVar76._0_4_ = iVar1;
            auVar76._8_4_ = iVar1;
            auVar76._12_4_ = iVar1;
            auVar76._16_4_ = iVar1;
            auVar76._20_4_ = iVar1;
            auVar76._24_4_ = iVar1;
            auVar76._28_4_ = iVar1;
            auVar35 = vpblendd_avx2(auVar35,auVar76,0x20);
            auVar77._4_4_ = iVar2;
            auVar77._0_4_ = iVar2;
            auVar77._8_4_ = iVar2;
            auVar77._12_4_ = iVar2;
            auVar77._16_4_ = iVar2;
            auVar77._20_4_ = iVar2;
            auVar77._24_4_ = iVar2;
            auVar77._28_4_ = iVar2;
            auVar35 = vpblendd_avx2(auVar35,auVar77,0x40);
            auVar78._4_4_ = iVar18;
            auVar78._0_4_ = iVar18;
            auVar78._8_4_ = iVar18;
            auVar78._12_4_ = iVar18;
            auVar78._16_4_ = iVar18;
            auVar78._20_4_ = iVar18;
            auVar78._24_4_ = iVar18;
            auVar78._28_4_ = iVar18;
            auVar35 = vpblendd_avx2(auVar35,auVar78,0x80);
            uVar19 = uVar15 >> 1;
            uVar8 = uVar19 & 0x1f;
            auVar79._0_8_ = CONCAT44(uVar19,uVar19) & 0x1f0000001f;
            auVar79._8_4_ = uVar8;
            auVar79._12_4_ = uVar8;
            auVar79._16_4_ = uVar8;
            auVar79._20_4_ = uVar8;
            auVar79._24_4_ = uVar8;
            auVar79._28_4_ = uVar8;
          }
          else {
            auVar42 = vpshufd_avx2(auVar67,0xd8);
            auVar58 = vpermq_avx2(auVar42,0xd8);
            auVar42 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)iVar18 + 8));
            auVar42 = vpshufd_avx2(auVar42,0xd8);
            auVar82 = vpermq_avx2(auVar42,0xd8);
            auVar50._4_4_ = iVar18;
            auVar50._0_4_ = iVar18;
            auVar50._8_4_ = iVar18;
            auVar50._12_4_ = iVar18;
            iVar1 = iVar18 + 10;
            iVar2 = iVar18 + 0xc;
            iVar18 = iVar18 + 0xe;
            auVar45 = vpaddd_avx(auVar50,auVar39);
            auVar42 = vpermq_avx2(ZEXT1632(auVar45),0xc4);
            auVar42 = vpblendd_avx2(auVar42,ZEXT1632(auVar50),1);
            auVar72._4_4_ = iVar1;
            auVar72._0_4_ = iVar1;
            auVar72._8_4_ = iVar1;
            auVar72._12_4_ = iVar1;
            auVar72._16_4_ = iVar1;
            auVar72._20_4_ = iVar1;
            auVar72._24_4_ = iVar1;
            auVar72._28_4_ = iVar1;
            auVar42 = vpblendd_avx2(auVar42,auVar72,0x20);
            auVar73._4_4_ = iVar2;
            auVar73._0_4_ = iVar2;
            auVar73._8_4_ = iVar2;
            auVar73._12_4_ = iVar2;
            auVar73._16_4_ = iVar2;
            auVar73._20_4_ = iVar2;
            auVar73._24_4_ = iVar2;
            auVar73._28_4_ = iVar2;
            auVar42 = vpblendd_avx2(auVar42,auVar73,0x40);
            auVar74._4_4_ = iVar18;
            auVar74._0_4_ = iVar18;
            auVar74._8_4_ = iVar18;
            auVar74._12_4_ = iVar18;
            auVar74._16_4_ = iVar18;
            auVar74._20_4_ = iVar18;
            auVar74._24_4_ = iVar18;
            auVar74._28_4_ = iVar18;
            auVar35 = vpblendd_avx2(auVar42,auVar74,0x80);
            auVar66._4_4_ = uVar15;
            auVar66._0_4_ = uVar15;
            auVar66._8_4_ = uVar15;
            auVar66._12_4_ = uVar15;
            auVar66._16_4_ = uVar15;
            auVar66._20_4_ = uVar15;
            auVar66._24_4_ = uVar15;
            auVar66._28_4_ = uVar15;
            auVar42 = vpslld_avx2(auVar66,ZEXT416((uint)upsample_above));
            auVar67._0_16_ = ZEXT116(0) * auVar82._0_16_ + ZEXT116(1) * auVar58._0_16_;
            auVar67._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar82._0_16_;
            auVar42 = vpsrld_avx2(auVar42,1);
            auVar79 = vpand_avx2(auVar42,auVar48);
            auVar42 = vperm2i128_avx2(auVar58,auVar82,0x31);
          }
          auVar35 = vpcmpgtd_avx2(auVar28,auVar35);
          auVar42 = vpsubd_avx2(auVar42,auVar67);
          auVar58 = vpmulld_avx2(auVar42,auVar79);
          auVar42 = vpslld_avx2(auVar67,5);
          auVar42 = vpaddd_avx2(auVar42,auVar32);
          auVar42 = vpaddd_avx2(auVar58,auVar42);
          auVar42 = vpsrld_avx2(auVar42,5);
          auVar49 = vpackusdw_avx(auVar42._0_16_,auVar42._16_16_);
          auVar45 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
          auVar42 = vpblendvb_avx2(auVar25,ZEXT1632(auVar49),ZEXT1632(auVar45));
          *pauVar16 = auVar42._0_16_;
          uVar15 = uVar15 + dx;
          uVar14 = uVar14 + 1;
          pauVar16 = pauVar16 + 1;
        } while (uVar17 != uVar14);
      }
      if (0 < bh) {
        lVar12 = 0;
        do {
          uVar5 = *(undefined8 *)((long)local_860 + lVar12 + 8);
          *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar12);
          *(undefined8 *)(dst + 4) = uVar5;
          lVar12 = lVar12 + 0x10;
          dst = dst + stride;
        } while (uVar17 << 4 != lVar12);
      }
    }
  }
  else if (bw == 0x10) {
    uVar3 = above[(long)bh + 0xf];
    auVar21._2_2_ = uVar3;
    auVar21._0_2_ = uVar3;
    auVar21._4_2_ = uVar3;
    auVar21._6_2_ = uVar3;
    auVar21._8_2_ = uVar3;
    auVar21._10_2_ = uVar3;
    auVar21._12_2_ = uVar3;
    auVar21._14_2_ = uVar3;
    auVar24._16_2_ = uVar3;
    auVar24._0_16_ = auVar21;
    auVar24._18_2_ = uVar3;
    auVar24._20_2_ = uVar3;
    auVar24._22_2_ = uVar3;
    auVar24._24_2_ = uVar3;
    auVar24._26_2_ = uVar3;
    auVar24._28_2_ = uVar3;
    auVar24._30_2_ = uVar3;
    iVar11 = bh + 0xf;
    auVar27._0_2_ = (undefined2)iVar11;
    auVar27._2_2_ = auVar27._0_2_;
    auVar27._4_2_ = auVar27._0_2_;
    auVar27._6_2_ = auVar27._0_2_;
    auVar27._8_2_ = auVar27._0_2_;
    auVar27._10_2_ = auVar27._0_2_;
    auVar27._12_2_ = auVar27._0_2_;
    auVar27._14_2_ = auVar27._0_2_;
    auVar27._16_2_ = auVar27._0_2_;
    auVar27._18_2_ = auVar27._0_2_;
    auVar27._20_2_ = auVar27._0_2_;
    auVar27._22_2_ = auVar27._0_2_;
    auVar27._24_2_ = auVar27._0_2_;
    auVar27._26_2_ = auVar27._0_2_;
    auVar27._28_2_ = auVar27._0_2_;
    auVar27._30_2_ = auVar27._0_2_;
    if (bd < 0xc) {
      if (bh < 1) {
        return;
      }
      pauVar13 = (undefined1 (*) [32])local_860;
      uVar14 = 0;
      auVar30._8_2_ = 0x10;
      auVar30._0_8_ = 0x10001000100010;
      auVar30._10_2_ = 0x10;
      auVar30._12_2_ = 0x10;
      auVar30._14_2_ = 0x10;
      auVar30._16_2_ = 0x10;
      auVar30._18_2_ = 0x10;
      auVar30._20_2_ = 0x10;
      auVar30._22_2_ = 0x10;
      auVar30._24_2_ = 0x10;
      auVar30._26_2_ = 0x10;
      auVar30._28_2_ = 0x10;
      auVar30._30_2_ = 0x10;
      auVar22 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
      uVar15 = dx;
      do {
        uVar19 = (int)uVar15 >> 6;
        if (iVar11 <= (int)uVar19) {
          if ((int)uVar14 < bh) {
            lVar12 = uVar17 - uVar14;
            do {
              *pauVar13 = auVar24;
              pauVar13 = pauVar13 + 1;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          break;
        }
        uVar4 = (ushort)(uVar15 >> 1);
        uVar33 = uVar4 & 0x1f;
        auVar34._0_8_ = CONCAT26(uVar4,CONCAT24(uVar4,CONCAT22(uVar4,uVar4))) & 0x1f001f001f001f;
        auVar34._8_2_ = uVar33;
        auVar34._10_2_ = uVar33;
        auVar34._12_2_ = uVar33;
        auVar34._14_2_ = uVar33;
        auVar34._16_2_ = uVar33;
        auVar34._18_2_ = uVar33;
        auVar34._20_2_ = uVar33;
        auVar34._22_2_ = uVar33;
        auVar34._24_2_ = uVar33;
        auVar34._26_2_ = uVar33;
        auVar34._28_2_ = uVar33;
        auVar34._30_2_ = uVar33;
        auVar42 = vpsubw_avx2(*(undefined1 (*) [32])(above + (long)(int)uVar19 + 1),
                              *(undefined1 (*) [32])(above + (int)uVar19));
        auVar35 = vpmullw_avx2(auVar42,auVar34);
        auVar42 = vpsllw_avx2(*(undefined1 (*) [32])(above + (int)uVar19),5);
        auVar42 = vpaddw_avx2(auVar42,auVar30);
        auVar42 = vpaddw_avx2(auVar35,auVar42);
        auVar35 = vpsrlw_avx2(auVar42,5);
        auVar38._0_2_ = (undefined2)uVar19;
        auVar38._2_2_ = auVar38._0_2_;
        auVar38._4_2_ = auVar38._0_2_;
        auVar38._6_2_ = auVar38._0_2_;
        auVar38._8_2_ = auVar38._0_2_;
        auVar38._10_2_ = auVar38._0_2_;
        auVar38._12_2_ = auVar38._0_2_;
        auVar38._14_2_ = auVar38._0_2_;
        auVar39 = vpaddw_avx(auVar38,auVar22);
        auVar45 = vpslldq_avx(auVar39,2);
        auVar45 = vpblendw_avx(auVar45,ZEXT416(uVar19),1);
        auVar39 = vpsrldq_avx(auVar39,0xe);
        auVar43._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar21;
        auVar43._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar39;
        auVar51._0_2_ = (undefined2)(uVar19 + 9);
        auVar51._2_2_ = auVar51._0_2_;
        auVar51._4_2_ = auVar51._0_2_;
        auVar51._6_2_ = auVar51._0_2_;
        auVar51._8_2_ = auVar51._0_2_;
        auVar51._10_2_ = auVar51._0_2_;
        auVar51._12_2_ = auVar51._0_2_;
        auVar51._14_2_ = auVar51._0_2_;
        auVar51._16_2_ = auVar51._0_2_;
        auVar51._18_2_ = auVar51._0_2_;
        auVar51._20_2_ = auVar51._0_2_;
        auVar51._22_2_ = auVar51._0_2_;
        auVar51._24_2_ = auVar51._0_2_;
        auVar51._26_2_ = auVar51._0_2_;
        auVar51._28_2_ = auVar51._0_2_;
        auVar51._30_2_ = auVar51._0_2_;
        auVar42 = vpblendw_avx2(auVar43,auVar51,2);
        auVar52._0_2_ = (undefined2)(uVar19 + 10);
        auVar52._2_2_ = auVar52._0_2_;
        auVar52._4_2_ = auVar52._0_2_;
        auVar52._6_2_ = auVar52._0_2_;
        auVar52._8_2_ = auVar52._0_2_;
        auVar52._10_2_ = auVar52._0_2_;
        auVar52._12_2_ = auVar52._0_2_;
        auVar52._14_2_ = auVar52._0_2_;
        auVar52._16_2_ = auVar52._0_2_;
        auVar52._18_2_ = auVar52._0_2_;
        auVar52._20_2_ = auVar52._0_2_;
        auVar52._22_2_ = auVar52._0_2_;
        auVar52._24_2_ = auVar52._0_2_;
        auVar52._26_2_ = auVar52._0_2_;
        auVar52._28_2_ = auVar52._0_2_;
        auVar52._30_2_ = auVar52._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar52,4);
        auVar53._0_2_ = (undefined2)(uVar19 + 0xb);
        auVar53._2_2_ = auVar53._0_2_;
        auVar53._4_2_ = auVar53._0_2_;
        auVar53._6_2_ = auVar53._0_2_;
        auVar53._8_2_ = auVar53._0_2_;
        auVar53._10_2_ = auVar53._0_2_;
        auVar53._12_2_ = auVar53._0_2_;
        auVar53._14_2_ = auVar53._0_2_;
        auVar53._16_2_ = auVar53._0_2_;
        auVar53._18_2_ = auVar53._0_2_;
        auVar53._20_2_ = auVar53._0_2_;
        auVar53._22_2_ = auVar53._0_2_;
        auVar53._24_2_ = auVar53._0_2_;
        auVar53._26_2_ = auVar53._0_2_;
        auVar53._28_2_ = auVar53._0_2_;
        auVar53._30_2_ = auVar53._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar53,8);
        auVar54._0_2_ = (undefined2)(uVar19 + 0xc);
        auVar54._2_2_ = auVar54._0_2_;
        auVar54._4_2_ = auVar54._0_2_;
        auVar54._6_2_ = auVar54._0_2_;
        auVar54._8_2_ = auVar54._0_2_;
        auVar54._10_2_ = auVar54._0_2_;
        auVar54._12_2_ = auVar54._0_2_;
        auVar54._14_2_ = auVar54._0_2_;
        auVar54._16_2_ = auVar54._0_2_;
        auVar54._18_2_ = auVar54._0_2_;
        auVar54._20_2_ = auVar54._0_2_;
        auVar54._22_2_ = auVar54._0_2_;
        auVar54._24_2_ = auVar54._0_2_;
        auVar54._26_2_ = auVar54._0_2_;
        auVar54._28_2_ = auVar54._0_2_;
        auVar54._30_2_ = auVar54._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar54,0x10);
        auVar55._0_2_ = (undefined2)(uVar19 + 0xd);
        auVar55._2_2_ = auVar55._0_2_;
        auVar55._4_2_ = auVar55._0_2_;
        auVar55._6_2_ = auVar55._0_2_;
        auVar55._8_2_ = auVar55._0_2_;
        auVar55._10_2_ = auVar55._0_2_;
        auVar55._12_2_ = auVar55._0_2_;
        auVar55._14_2_ = auVar55._0_2_;
        auVar55._16_2_ = auVar55._0_2_;
        auVar55._18_2_ = auVar55._0_2_;
        auVar55._20_2_ = auVar55._0_2_;
        auVar55._22_2_ = auVar55._0_2_;
        auVar55._24_2_ = auVar55._0_2_;
        auVar55._26_2_ = auVar55._0_2_;
        auVar55._28_2_ = auVar55._0_2_;
        auVar55._30_2_ = auVar55._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar55,0x20);
        auVar56._0_2_ = (undefined2)(uVar19 + 0xe);
        auVar56._2_2_ = auVar56._0_2_;
        auVar56._4_2_ = auVar56._0_2_;
        auVar56._6_2_ = auVar56._0_2_;
        auVar56._8_2_ = auVar56._0_2_;
        auVar56._10_2_ = auVar56._0_2_;
        auVar56._12_2_ = auVar56._0_2_;
        auVar56._14_2_ = auVar56._0_2_;
        auVar56._16_2_ = auVar56._0_2_;
        auVar56._18_2_ = auVar56._0_2_;
        auVar56._20_2_ = auVar56._0_2_;
        auVar56._22_2_ = auVar56._0_2_;
        auVar56._24_2_ = auVar56._0_2_;
        auVar56._26_2_ = auVar56._0_2_;
        auVar56._28_2_ = auVar56._0_2_;
        auVar56._30_2_ = auVar56._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar56,0x40);
        auVar57._0_2_ = (undefined2)(uVar19 + 0xf);
        auVar57._2_2_ = auVar57._0_2_;
        auVar57._4_2_ = auVar57._0_2_;
        auVar57._6_2_ = auVar57._0_2_;
        auVar57._8_2_ = auVar57._0_2_;
        auVar57._10_2_ = auVar57._0_2_;
        auVar57._12_2_ = auVar57._0_2_;
        auVar57._14_2_ = auVar57._0_2_;
        auVar57._16_2_ = auVar57._0_2_;
        auVar57._18_2_ = auVar57._0_2_;
        auVar57._20_2_ = auVar57._0_2_;
        auVar57._22_2_ = auVar57._0_2_;
        auVar57._24_2_ = auVar57._0_2_;
        auVar57._26_2_ = auVar57._0_2_;
        auVar57._28_2_ = auVar57._0_2_;
        auVar57._30_2_ = auVar57._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar57,0x80);
        auVar42 = vpblendd_avx2(ZEXT1632(auVar45),auVar42,0xf0);
        auVar42 = vpcmpgtw_avx2(auVar27,auVar42);
        auVar42 = vpblendvb_avx2(auVar24,auVar35,auVar42);
        *pauVar13 = auVar42;
        uVar15 = uVar15 + dx;
        uVar14 = uVar14 + 1;
        pauVar13 = pauVar13 + 1;
      } while (uVar17 != uVar14);
    }
    else {
      if (bh < 1) {
        return;
      }
      pauVar13 = (undefined1 (*) [32])local_860;
      uVar14 = 0;
      auVar31._8_4_ = 0x10;
      auVar31._0_8_ = 0x1000000010;
      auVar31._12_4_ = 0x10;
      auVar31._16_4_ = 0x10;
      auVar31._20_4_ = 0x10;
      auVar31._24_4_ = 0x10;
      auVar31._28_4_ = 0x10;
      auVar22 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
      uVar15 = dx;
      do {
        uVar19 = (int)uVar15 >> 6;
        if (iVar11 <= (int)uVar19) {
          if ((int)uVar14 < bh) {
            lVar12 = uVar17 - uVar14;
            do {
              *pauVar13 = auVar24;
              pauVar13 = pauVar13 + 1;
              lVar12 = lVar12 + -1;
            } while (lVar12 != 0);
          }
          break;
        }
        uVar8 = uVar15 >> 1;
        uVar9 = uVar8 & 0x1f;
        auVar36._0_8_ = CONCAT44(uVar8,uVar8) & 0x1f0000001f;
        auVar36._8_4_ = uVar9;
        auVar36._12_4_ = uVar9;
        auVar36._16_4_ = uVar9;
        auVar36._20_4_ = uVar9;
        auVar36._24_4_ = uVar9;
        auVar36._28_4_ = uVar9;
        auVar39 = auVar21;
        if ((int)uVar19 < bh + 7) {
          auVar42 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar19 + 8));
          auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar19 + 9));
          auVar35 = vpsubd_avx2(auVar35,auVar42);
          auVar42 = vpslld_avx2(auVar42,5);
          auVar35 = vpmulld_avx2(auVar35,auVar36);
          auVar42 = vpaddd_avx2(auVar42,auVar31);
          auVar42 = vpaddd_avx2(auVar35,auVar42);
          auVar42 = vpsrld_avx2(auVar42,5);
          auVar47._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar42._16_16_;
          auVar47._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar21;
          auVar42 = vpackusdw_avx2(auVar42,auVar47);
          auVar39 = auVar42._0_16_;
        }
        auVar42 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (int)uVar19));
        auVar35 = vpmovzxwd_avx2(*(undefined1 (*) [16])(above + (long)(int)uVar19 + 1));
        auVar35 = vpsubd_avx2(auVar35,auVar42);
        auVar42 = vpslld_avx2(auVar42,5);
        auVar35 = vpmulld_avx2(auVar35,auVar36);
        auVar42 = vpaddd_avx2(auVar42,auVar31);
        auVar42 = vpaddd_avx2(auVar35,auVar42);
        auVar42 = vpsrld_avx2(auVar42,5);
        auVar42 = vpackusdw_avx2(auVar42,ZEXT1632(auVar42._16_16_));
        auVar37._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar42._0_16_;
        auVar37._16_16_ = ZEXT116(0) * auVar42._16_16_ + ZEXT116(1) * auVar39;
        auVar40._0_2_ = (undefined2)uVar19;
        auVar40._2_2_ = auVar40._0_2_;
        auVar40._4_2_ = auVar40._0_2_;
        auVar40._6_2_ = auVar40._0_2_;
        auVar40._8_2_ = auVar40._0_2_;
        auVar40._10_2_ = auVar40._0_2_;
        auVar40._12_2_ = auVar40._0_2_;
        auVar40._14_2_ = auVar40._0_2_;
        auVar39 = vpaddw_avx(auVar40,auVar22);
        auVar45 = vpslldq_avx(auVar39,2);
        auVar45 = vpblendw_avx(auVar45,ZEXT416(uVar19),1);
        auVar39 = vpsrldq_avx(auVar39,0xe);
        auVar44._0_16_ = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar21;
        auVar44._16_16_ = ZEXT116(0) * auVar24._16_16_ + ZEXT116(1) * auVar39;
        auVar59._0_2_ = (undefined2)(uVar19 + 9);
        auVar59._2_2_ = auVar59._0_2_;
        auVar59._4_2_ = auVar59._0_2_;
        auVar59._6_2_ = auVar59._0_2_;
        auVar59._8_2_ = auVar59._0_2_;
        auVar59._10_2_ = auVar59._0_2_;
        auVar59._12_2_ = auVar59._0_2_;
        auVar59._14_2_ = auVar59._0_2_;
        auVar59._16_2_ = auVar59._0_2_;
        auVar59._18_2_ = auVar59._0_2_;
        auVar59._20_2_ = auVar59._0_2_;
        auVar59._22_2_ = auVar59._0_2_;
        auVar59._24_2_ = auVar59._0_2_;
        auVar59._26_2_ = auVar59._0_2_;
        auVar59._28_2_ = auVar59._0_2_;
        auVar59._30_2_ = auVar59._0_2_;
        auVar42 = vpblendw_avx2(auVar44,auVar59,2);
        auVar60._0_2_ = (undefined2)(uVar19 + 10);
        auVar60._2_2_ = auVar60._0_2_;
        auVar60._4_2_ = auVar60._0_2_;
        auVar60._6_2_ = auVar60._0_2_;
        auVar60._8_2_ = auVar60._0_2_;
        auVar60._10_2_ = auVar60._0_2_;
        auVar60._12_2_ = auVar60._0_2_;
        auVar60._14_2_ = auVar60._0_2_;
        auVar60._16_2_ = auVar60._0_2_;
        auVar60._18_2_ = auVar60._0_2_;
        auVar60._20_2_ = auVar60._0_2_;
        auVar60._22_2_ = auVar60._0_2_;
        auVar60._24_2_ = auVar60._0_2_;
        auVar60._26_2_ = auVar60._0_2_;
        auVar60._28_2_ = auVar60._0_2_;
        auVar60._30_2_ = auVar60._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar60,4);
        auVar61._0_2_ = (undefined2)(uVar19 + 0xb);
        auVar61._2_2_ = auVar61._0_2_;
        auVar61._4_2_ = auVar61._0_2_;
        auVar61._6_2_ = auVar61._0_2_;
        auVar61._8_2_ = auVar61._0_2_;
        auVar61._10_2_ = auVar61._0_2_;
        auVar61._12_2_ = auVar61._0_2_;
        auVar61._14_2_ = auVar61._0_2_;
        auVar61._16_2_ = auVar61._0_2_;
        auVar61._18_2_ = auVar61._0_2_;
        auVar61._20_2_ = auVar61._0_2_;
        auVar61._22_2_ = auVar61._0_2_;
        auVar61._24_2_ = auVar61._0_2_;
        auVar61._26_2_ = auVar61._0_2_;
        auVar61._28_2_ = auVar61._0_2_;
        auVar61._30_2_ = auVar61._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar61,8);
        auVar62._0_2_ = (undefined2)(uVar19 + 0xc);
        auVar62._2_2_ = auVar62._0_2_;
        auVar62._4_2_ = auVar62._0_2_;
        auVar62._6_2_ = auVar62._0_2_;
        auVar62._8_2_ = auVar62._0_2_;
        auVar62._10_2_ = auVar62._0_2_;
        auVar62._12_2_ = auVar62._0_2_;
        auVar62._14_2_ = auVar62._0_2_;
        auVar62._16_2_ = auVar62._0_2_;
        auVar62._18_2_ = auVar62._0_2_;
        auVar62._20_2_ = auVar62._0_2_;
        auVar62._22_2_ = auVar62._0_2_;
        auVar62._24_2_ = auVar62._0_2_;
        auVar62._26_2_ = auVar62._0_2_;
        auVar62._28_2_ = auVar62._0_2_;
        auVar62._30_2_ = auVar62._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar62,0x10);
        auVar63._0_2_ = (undefined2)(uVar19 + 0xd);
        auVar63._2_2_ = auVar63._0_2_;
        auVar63._4_2_ = auVar63._0_2_;
        auVar63._6_2_ = auVar63._0_2_;
        auVar63._8_2_ = auVar63._0_2_;
        auVar63._10_2_ = auVar63._0_2_;
        auVar63._12_2_ = auVar63._0_2_;
        auVar63._14_2_ = auVar63._0_2_;
        auVar63._16_2_ = auVar63._0_2_;
        auVar63._18_2_ = auVar63._0_2_;
        auVar63._20_2_ = auVar63._0_2_;
        auVar63._22_2_ = auVar63._0_2_;
        auVar63._24_2_ = auVar63._0_2_;
        auVar63._26_2_ = auVar63._0_2_;
        auVar63._28_2_ = auVar63._0_2_;
        auVar63._30_2_ = auVar63._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar63,0x20);
        auVar64._0_2_ = (undefined2)(uVar19 + 0xe);
        auVar64._2_2_ = auVar64._0_2_;
        auVar64._4_2_ = auVar64._0_2_;
        auVar64._6_2_ = auVar64._0_2_;
        auVar64._8_2_ = auVar64._0_2_;
        auVar64._10_2_ = auVar64._0_2_;
        auVar64._12_2_ = auVar64._0_2_;
        auVar64._14_2_ = auVar64._0_2_;
        auVar64._16_2_ = auVar64._0_2_;
        auVar64._18_2_ = auVar64._0_2_;
        auVar64._20_2_ = auVar64._0_2_;
        auVar64._22_2_ = auVar64._0_2_;
        auVar64._24_2_ = auVar64._0_2_;
        auVar64._26_2_ = auVar64._0_2_;
        auVar64._28_2_ = auVar64._0_2_;
        auVar64._30_2_ = auVar64._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar64,0x40);
        auVar65._0_2_ = (undefined2)(uVar19 + 0xf);
        auVar65._2_2_ = auVar65._0_2_;
        auVar65._4_2_ = auVar65._0_2_;
        auVar65._6_2_ = auVar65._0_2_;
        auVar65._8_2_ = auVar65._0_2_;
        auVar65._10_2_ = auVar65._0_2_;
        auVar65._12_2_ = auVar65._0_2_;
        auVar65._14_2_ = auVar65._0_2_;
        auVar65._16_2_ = auVar65._0_2_;
        auVar65._18_2_ = auVar65._0_2_;
        auVar65._20_2_ = auVar65._0_2_;
        auVar65._22_2_ = auVar65._0_2_;
        auVar65._24_2_ = auVar65._0_2_;
        auVar65._26_2_ = auVar65._0_2_;
        auVar65._28_2_ = auVar65._0_2_;
        auVar65._30_2_ = auVar65._0_2_;
        auVar42 = vpblendw_avx2(auVar42,auVar65,0x80);
        auVar42 = vpblendd_avx2(ZEXT1632(auVar45),auVar42,0xf0);
        auVar42 = vpcmpgtw_avx2(auVar27,auVar42);
        auVar42 = vpblendvb_avx2(auVar24,auVar37,auVar42);
        *pauVar13 = auVar42;
        uVar15 = uVar15 + dx;
        uVar14 = uVar14 + 1;
        pauVar13 = pauVar13 + 1;
      } while (uVar17 != uVar14);
    }
    if (0 < bh) {
      lVar12 = 0;
      do {
        uVar5 = *(undefined8 *)((long)local_860 + lVar12 + 8);
        uVar6 = *(undefined8 *)((long)local_860 + lVar12 + 0x10);
        uVar7 = *(undefined8 *)((long)local_860 + lVar12 + 0x18);
        *(undefined8 *)dst = *(undefined8 *)((long)local_860 + lVar12);
        *(undefined8 *)(dst + 4) = uVar5;
        *(undefined8 *)(dst + 8) = uVar6;
        *(undefined8 *)(dst + 0xc) = uVar7;
        lVar12 = lVar12 + 0x20;
        dst = dst + stride;
      } while (uVar17 << 5 != lVar12);
    }
  }
  else if (bw == 0x20) {
    highbd_dr_prediction_z1_32xN_avx2(bh,dst,stride,above,dx,bd,in_stack_fffffffffffff780);
  }
  else if (bw == 0x40) {
    if (bd < 0xc) {
      highbd_dr_prediction_z1_64xN_avx2(bh,dst,stride,above,dx,bd);
    }
    else {
      highbd_dr_prediction_32bit_z1_64xN_avx2(bh,dst,stride,above,dx,bd);
    }
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z1_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_above,
                                      int dx, int dy, int bd) {
  (void)left;
  (void)dy;

  switch (bw) {
    case 4:
      highbd_dr_prediction_z1_4xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 8:
      highbd_dr_prediction_z1_8xN_avx2(bh, dst, stride, above, upsample_above,
                                       dx, bd);
      break;
    case 16:
      highbd_dr_prediction_z1_16xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 32:
      highbd_dr_prediction_z1_32xN_avx2(bh, dst, stride, above, upsample_above,
                                        dx, bd);
      break;
    case 64:
      if (bd < 12) {
        highbd_dr_prediction_z1_64xN_avx2(bh, dst, stride, above,
                                          upsample_above, dx);
      } else {
        highbd_dr_prediction_32bit_z1_64xN_avx2(bh, dst, stride, above,
                                                upsample_above, dx);
      }
      break;
    default: break;
  }
  return;
}